

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::RayFromToCaster::Process(RayFromToCaster *this,btDbvtNode *leaf)

{
  Face *pFVar1;
  btScalar bVar2;
  
  pFVar1 = (Face *)(leaf->field_2).childs[0];
  bVar2 = rayFromToTriangle(&this->m_rayFrom,&this->m_rayTo,&this->m_rayNormalizedDirection,
                            (btVector3 *)(*(long *)((btVector3 *)pFVar1->m_n)->m_floats + 0x10),
                            (btVector3 *)
                            (*(long *)(((btVector3 *)pFVar1->m_n)->m_floats + 2) + 0x10),
                            (btVector3 *)(*(long *)((btVector3 *)pFVar1->m_n + 1) + 0x10),
                            this->m_mint);
  if ((0.0 < bVar2) && (bVar2 < this->m_mint)) {
    this->m_mint = bVar2;
    this->m_face = pFVar1;
  }
  this->m_tests = this->m_tests + 1;
  return;
}

Assistant:

void				btSoftBody::RayFromToCaster::Process(const btDbvtNode* leaf)
{
	btSoftBody::Face&	f=*(btSoftBody::Face*)leaf->data;
	const btScalar		t=rayFromToTriangle(	m_rayFrom,m_rayTo,m_rayNormalizedDirection,
		f.m_n[0]->m_x,
		f.m_n[1]->m_x,
		f.m_n[2]->m_x,
		m_mint);
	if((t>0)&&(t<m_mint)) 
	{ 
		m_mint=t;m_face=&f; 
	}
	++m_tests;
}